

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

Gia_Man_t * Acb_NtkToGia2(Acb_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int iVar6;
  Gia_Man_t *p_00;
  char *pcVar7;
  size_t sVar8;
  char *__dest;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *vTemp;
  Vec_Int_t *__ptr;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  
  p_00 = Gia_ManStart((p->vObjType).nSize * 2 + 0x3e6);
  pcVar7 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  if (pcVar7 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar7);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,pcVar7);
  }
  p_00->pName = __dest;
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar1) {
    piVar9 = (p->vObjCopy).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)(int)uVar1 << 2);
    }
    (p->vObjCopy).pArray = piVar9;
    if (piVar9 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjCopy).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar1 * 4);
  }
  (p->vObjCopy).nSize = uVar1;
  if (0 < (p->vCis).nSize) {
    lVar15 = 0;
    do {
      uVar1 = (p->vCis).pArray[lVar15];
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00388040;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00388040;
      if ((int)uVar1 < 1) goto LAB_00388087;
      uVar13 = (p->vObjCopy).nSize;
      if ((int)uVar13 < 1) goto LAB_0038807e;
      if (uVar13 <= uVar1) goto LAB_0038805f;
      piVar9 = (p->vObjCopy).pArray;
      if (piVar9[uVar1] != -1) goto LAB_003880a6;
      piVar9[uVar1] = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vCis).nSize);
  }
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 0x10;
  vTemp->nSize = 0;
  piVar9 = (int *)malloc(0x40);
  vTemp->pArray = piVar9;
  __ptr = Acb_NtkFindNodes2(p);
  iVar2 = __ptr->nSize;
  piVar9 = __ptr->pArray;
  if ((long)iVar2 < 1) {
    if (piVar9 == (int *)0x0) goto LAB_00387e0b;
  }
  else {
    lVar15 = 0;
    do {
      uVar1 = piVar9[lVar15];
      lVar16 = (long)(int)uVar1;
      iVar6 = Acb_ObjToGia2(p_00,p,uVar1,vTemp);
      if (lVar16 < 1) goto LAB_00388087;
      uVar13 = (p->vObjCopy).nSize;
      if ((int)uVar13 < 1) goto LAB_0038807e;
      if (uVar13 <= uVar1) goto LAB_0038805f;
      piVar5 = (p->vObjCopy).pArray;
      if (piVar5[lVar16] != -1) {
LAB_003880a6:
        __assert_fail("Acb_ObjCopy(p, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x11a,"void Acb_ObjSetCopy(Acb_Ntk_t *, int, int)");
      }
      piVar5[lVar16] = iVar6;
      lVar15 = lVar15 + 1;
    } while (iVar2 != lVar15);
  }
  free(piVar9);
LAB_00387e0b:
  free(__ptr);
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
  }
  free(vTemp);
  if (0 < (p->vCos).nSize) {
    lVar15 = 0;
    do {
      iVar2 = (p->vCos).pArray[lVar15];
      if ((long)iVar2 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar2) {
LAB_0038805f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vObjFans).pArray[iVar2];
      if (((long)iVar2 < 0) || ((p->vFanSto).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar1 = (p->vFanSto).pArray[(long)iVar2 + 1];
      if ((long)(int)uVar1 < 1) goto LAB_00388087;
      uVar13 = (p->vObjCopy).nSize;
      if ((int)uVar13 < 1) goto LAB_0038807e;
      if (uVar13 <= uVar1) goto LAB_0038805f;
      uVar1 = (p->vObjCopy).pArray[(int)uVar1];
      if ((int)uVar1 < 0) {
LAB_003880c5:
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x30e,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar13 = uVar1 >> 1;
      if (p_00->nObjs <= (int)uVar13) goto LAB_003880c5;
      if ((~*(uint *)(p_00->pObjs + uVar13) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_00->pObjs + uVar13) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x30f,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar3 | 0x80000000;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_00388040:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar12 = (ulong)(((uint)((int)pGVar10 - (int)pGVar4) >> 2) * -0x55555555 - uVar13 & 0x1fffffff
                      );
      uVar14 = (ulong)((uVar1 & 1) << 0x1d);
      *(ulong *)pGVar10 = uVar14 | uVar3 & 0xffffffffc0000000 | 0x80000000 | uVar12;
      *(ulong *)pGVar10 =
           uVar14 | uVar3 & 0xe0000000c0000000 | 0x80000000 | uVar12 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00388040;
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),pGVar10)
        ;
      }
      if ((pGVar10 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar10)) goto LAB_00388040;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vCos).nSize);
  }
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManUpdateCopy(&p->vObjCopy,p_00);
  Gia_ManStop(p_00);
  return pGVar11;
LAB_00388087:
  pcVar7 = "i>0";
  goto LAB_0038808e;
LAB_0038807e:
  pcVar7 = "Acb_NtkHasObjCopies(p)";
LAB_0038808e:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
}

Assistant:

Gia_Man_t * Acb_NtkToGia2( Acb_Ntk_t * p )
{
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins, * vNodes;
    int i, iObj;
    pNew = Gia_ManStart( 2 * Acb_NtkObjNum(p) + 1000 );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Acb_NtkCleanObjCopies( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    vFanins = Vec_IntAlloc( 4 );
    vNodes  = Acb_NtkFindNodes2( p );
    Vec_IntForEachEntry( vNodes, iObj, i )
        Acb_ObjSetCopy( p, iObj, Acb_ObjToGia2(pNew, p, iObj, vFanins) );
    Vec_IntFree( vNodes );
    Vec_IntFree( vFanins );
    Acb_NtkForEachCo( p, iObj, i )
        Gia_ManAppendCo( pNew, Acb_ObjCopy(p, Acb_ObjFanin(p, iObj, 0)) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManUpdateCopy( &p->vObjCopy, pOne );
    Gia_ManStop( pOne );
    return pNew;
}